

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReorder.c
# Opt level: O2

void Abc_NodeBddReorder(reo_man *p,Abc_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int *pOrder;
  ulong uVar3;
  DdNode *n;
  ulong uVar4;
  long lVar5;
  
  uVar1 = (pNode->vFanins).nSize;
  pOrder = (int *)malloc((long)(int)uVar1 << 2);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pOrder[uVar3] = -1;
  }
  n = Extra_Reorder(p,(DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData,pOrder);
  Cudd_Ref(n);
  Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,(DdNode *)(pNode->field_5).pData);
  (pNode->field_5).pData = n;
  iVar2 = (pNode->vFanins).nSize;
  for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    pOrder[lVar5] = (pNode->vFanins).pArray[pOrder[lVar5]];
  }
  for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    (pNode->vFanins).pArray[lVar5] = pOrder[lVar5];
    iVar2 = (pNode->vFanins).nSize;
  }
  free(pOrder);
  return;
}

Assistant:

void Abc_NodeBddReorder( reo_man * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    DdNode * bFunc;
    int * pOrder, i;
    // create the temporary array for the variable order
    pOrder = ABC_ALLOC( int, Abc_ObjFaninNum(pNode) );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        pOrder[i] = -1;
    // reorder the BDD
    bFunc = Extra_Reorder( p, (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData, pOrder ); Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, (DdNode *)pNode->pData );
    pNode->pData = bFunc;
    // update the fanin order
    Abc_ObjForEachFanin( pNode, pFanin, i )
        pOrder[i] = pNode->vFanins.pArray[ pOrder[i] ];
    Abc_ObjForEachFanin( pNode, pFanin, i )
        pNode->vFanins.pArray[i] = pOrder[i];
    ABC_FREE( pOrder );
}